

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O3

void multipredict<true>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                       polyprediction *pred,bool finalize_predictions)

{
  vw *all;
  undefined1 auVar1 [16];
  ulong uVar2;
  vw *pvVar3;
  uint64_t uVar4;
  polyprediction *ppVar5;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  multipredict_info<sparse_parameters> mp;
  multipredict_info<sparse_parameters> local_58;
  long lVar12;
  
  auVar1 = _DAT_0027d900;
  all = b->all;
  pvVar3 = all;
  if (count != 0) {
    fVar8 = (ec->l).simple.initial;
    uVar2 = count + 3 & 0xfffffffffffffffc;
    lVar12 = count - 1;
    auVar9._8_4_ = (int)lVar12;
    auVar9._0_8_ = lVar12;
    auVar9._12_4_ = (int)((ulong)lVar12 >> 0x20);
    ppVar5 = pred + 3;
    auVar9 = auVar9 ^ _DAT_0027d900;
    auVar11 = _DAT_0027f720;
    auVar13 = _DAT_0027f730;
    do {
      auVar14 = auVar13 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_
                  ) & 1)) {
        ppVar5[-3].scalar = fVar8;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        ppVar5[-2].scalar = fVar8;
      }
      auVar14 = auVar11 ^ auVar1;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
        ppVar5[-1].scalar = fVar8;
        ppVar5->scalar = fVar8;
      }
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      ppVar5 = ppVar5 + 4;
      uVar2 = uVar2 - 4;
    } while (uVar2 != 0);
    pvVar3 = b->all;
  }
  local_58.count = count;
  local_58.step = step;
  local_58.pred = pred;
  if ((pvVar3->weights).sparse == true) {
    local_58.weights = &(all->weights).sparse_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_58);
  }
  else {
    local_58.weights = (sparse_parameters *)&(all->weights).dense_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_58);
  }
  ppVar5 = pred;
  sVar6 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar5->scalar = (float)all->sd->contraction * ppVar5->scalar;
      sVar6 = sVar6 - 1;
      ppVar5 = ppVar5 + 1;
    } while (sVar6 != 0);
  }
  ppVar5 = pred;
  sVar7 = count;
  sVar6 = count;
  if (finalize_predictions && count != 0) {
    do {
      fVar8 = GD::finalize_prediction(all->sd,ppVar5->scalar);
      ppVar5->scalar = fVar8;
      sVar7 = sVar7 - 1;
      ppVar5 = ppVar5 + 1;
    } while (sVar7 != 0);
  }
  else if (count == 0) {
    uVar4 = (ec->super_example_predict).ft_offset;
    goto LAB_002110b2;
  }
  do {
    (ec->pred).scalar = pred->scalar;
    GD::print_audit_features(all,ec);
    uVar4 = (ec->super_example_predict).ft_offset + step;
    (ec->super_example_predict).ft_offset = uVar4;
    pred = pred + 1;
    sVar6 = sVar6 - 1;
  } while (sVar6 != 0);
LAB_002110b2:
  (ec->super_example_predict).ft_offset = uVar4 - step * count;
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}